

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* utilities::split(string *s,char delimiter)

{
  bool bVar1;
  istream *piVar2;
  char in_DL;
  string *in_RSI;
  value_type *in_RDI;
  istringstream tokenStream;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  value_type *this;
  istringstream local_1b8 [384];
  string local_38 [38];
  byte local_12;
  char local_11;
  string *local_10;
  
  local_12 = 0;
  this = in_RDI;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11d08a);
  std::__cxx11::string::string(local_38);
  std::__cxx11::istringstream::istringstream(local_1b8,local_10,_S_in);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b8,local_38,local_11);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,in_RDI);
  }
  local_12 = 1;
  std::__cxx11::istringstream::~istringstream(local_1b8);
  std::__cxx11::string::~string(local_38);
  if ((local_12 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this;
}

Assistant:

std::vector<std::string> split(const std::string& s, char delimiter)
    {
        std::vector<std::string> tokens;
        std::string token;
        std::istringstream tokenStream(s);
        while (std::getline(tokenStream, token, delimiter))
        {
            tokens.push_back(token);
        }
        return tokens;
    }